

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O2

void __thiscall QSpinBoxPrivate::QSpinBoxPrivate(QSpinBoxPrivate *this)

{
  QVariant *this_00;
  long in_FS_OFFSET;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractSpinBoxPrivate::QAbstractSpinBoxPrivate(&this->super_QAbstractSpinBoxPrivate);
  *(undefined ***)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate =
       &PTR__QAbstractSpinBoxPrivate_007d44b0;
  ::QVariant::QVariant(&local_40,0);
  this_00 = &(this->super_QAbstractSpinBoxPrivate).minimum;
  ::QVariant::operator=(this_00,&local_40);
  ::QVariant::~QVariant(&local_40);
  ::QVariant::QVariant(&local_40,99);
  ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).maximum,&local_40);
  ::QVariant::~QVariant(&local_40);
  ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).value,this_00);
  *(undefined4 *)&(this->super_QAbstractSpinBoxPrivate).field_0x3d4 = 10;
  ::QVariant::QVariant(&local_40,1);
  ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).singleStep,&local_40);
  ::QVariant::~QVariant(&local_40);
  (this->super_QAbstractSpinBoxPrivate).type = Int;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSpinBoxPrivate::QSpinBoxPrivate()
{
    minimum = QVariant((int)0);
    maximum = QVariant((int)99);
    value = minimum;
    displayIntegerBase = 10;
    singleStep = QVariant((int)1);
    type = QMetaType::Int;
}